

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

upb_MutableMessageValue upb_Array_GetMutable(upb_Array *arr,size_t i)

{
  ulong uVar1;
  sbyte sVar2;
  upb_MutableMessageValue ret;
  upb_MutableMessageValue local_10;
  
  if (i < arr->size_dont_copy_me__upb_internal_use_only) {
    uVar1 = arr->data_dont_copy_me__upb_internal_use_only;
    sVar2 = ((uVar1 & 3) != 0) + ((byte)uVar1 & 3);
    memcpy(&local_10,(void *)((i << sVar2) + (uVar1 & 0xfffffffffffffff8)),(ulong)(uint)(1 << sVar2)
          );
    return (upb_MutableMessageValue)local_10.array;
  }
  __assert_fail("i < upb_Array_Size(arr)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/array.c"
                ,0x27,"upb_MutableMessageValue upb_Array_GetMutable(upb_Array *, size_t)");
}

Assistant:

upb_MutableMessageValue upb_Array_GetMutable(upb_Array* arr, size_t i) {
  UPB_ASSERT(i < upb_Array_Size(arr));
  upb_MutableMessageValue ret;
  char* data = upb_Array_MutableDataPtr(arr);
  const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
  memcpy(&ret, data + (i << lg2), 1 << lg2);
  return ret;
}